

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt__csctx_rmove_to(stbtt__csctx *ctx,float dx,float dy)

{
  float fVar1;
  float dy_local;
  float dx_local;
  stbtt__csctx *ctx_local;
  
  stbtt__csctx_close_shape(ctx);
  fVar1 = ctx->x + dx;
  ctx->x = fVar1;
  ctx->first_x = fVar1;
  fVar1 = ctx->y + dy;
  ctx->y = fVar1;
  ctx->first_y = fVar1;
  stbtt__csctx_v(ctx,'\x01',(int)ctx->x,(int)ctx->y,0,0,0,0);
  return;
}

Assistant:

static void stbtt__csctx_rmove_to(stbtt__csctx *ctx, float dx, float dy)
{
   stbtt__csctx_close_shape(ctx);
   ctx->first_x = ctx->x = ctx->x + dx;
   ctx->first_y = ctx->y = ctx->y + dy;
   stbtt__csctx_v(ctx, STBTT_vmove, (int)ctx->x, (int)ctx->y, 0, 0, 0, 0);
}